

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzD.cpp
# Opt level: O3

void __thiscall chrono::fea::ChNodeFEAxyzD::SetNoSpeedNoAcceleration(ChNodeFEAxyzD *this)

{
  double dVar1;
  
  ChNodeFEAxyz::SetNoSpeedNoAcceleration(&this->super_ChNodeFEAxyz);
  dVar1 = DAT_00b689a0;
  if (this != (ChNodeFEAxyzD *)Q_ROTATE_Y_TO_Z) {
    (this->D_dt).m_data[0] = VNULL;
    (this->D_dt).m_data[1] = dVar1;
    (this->D_dt).m_data[2] = DAT_00b689a8;
  }
  dVar1 = DAT_00b689a0;
  if (this != (ChNodeFEAxyzD *)&DAT_00b68878) {
    (this->D_dtdt).m_data[0] = VNULL;
    (this->D_dtdt).m_data[1] = dVar1;
    (this->D_dtdt).m_data[2] = DAT_00b689a8;
  }
  return;
}

Assistant:

void ChNodeFEAxyzD::SetNoSpeedNoAcceleration() {
    ChNodeFEAxyz::SetNoSpeedNoAcceleration();

    D_dt = VNULL;
    D_dtdt = VNULL;
}